

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp4::groebnerRow7_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  lVar12 = (long)targetRow;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar12 + 0x271];
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar14,auVar11);
  auVar15._0_8_ =
       auVar13._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x278];
  auVar15._8_8_ = auVar13._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x271] = 0.0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x291];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar12 + 0x28a];
  auVar13 = vfmadd213sd_fma(auVar16,auVar15,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x28a] = auVar13._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2aa];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x2a3];
  auVar13 = vfmadd213sd_fma(auVar17,auVar15,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x2a3] = auVar13._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2c3];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 700];
  auVar13 = vfmadd213sd_fma(auVar18,auVar15,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 700] = auVar13._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2dc];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x2d5];
  auVar13 = vfmadd213sd_fma(auVar19,auVar15,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x2d5] = auVar13._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2f5];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x2ee];
  auVar13 = vfmadd213sd_fma(auVar20,auVar15,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x2ee] = auVar13._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x30e];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x307];
  auVar13 = vfmadd213sd_fma(auVar21,auVar15,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x307] = auVar13._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x327];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 800];
  auVar13 = vfmadd213sd_fma(auVar22,auVar15,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 800] = auVar13._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x340];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x339];
  auVar13 = vfmadd213sd_fma(auVar23,auVar15,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x339] = auVar13._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x359];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x352];
  auVar13 = vfmadd213sd_fma(auVar24,auVar15,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x352] = auVar13._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x372];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar12 + 0x36b];
  auVar13 = vfmadd213sd_fma(auVar25,auVar15,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 0x36b] = auVar13._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x38b];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar12 + 900];
  auVar13 = vfmadd213sd_fma(auVar26,auVar15,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar12 + 900] = auVar13._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow7_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,25) / groebnerMatrix(7,25);
  groebnerMatrix(targetRow,25) = 0.0;
  groebnerMatrix(targetRow,26) -= factor * groebnerMatrix(7,26);
  groebnerMatrix(targetRow,27) -= factor * groebnerMatrix(7,27);
  groebnerMatrix(targetRow,28) -= factor * groebnerMatrix(7,28);
  groebnerMatrix(targetRow,29) -= factor * groebnerMatrix(7,29);
  groebnerMatrix(targetRow,30) -= factor * groebnerMatrix(7,30);
  groebnerMatrix(targetRow,31) -= factor * groebnerMatrix(7,31);
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(7,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(7,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(7,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(7,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(7,36);
}